

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O0

void __thiscall SqlGenerator::generateOutputQueries(SqlGenerator *this)

{
  bool bVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  View *__lhs_00;
  ulong uVar2;
  QueryCompiler *pQVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  size_t agg;
  string orderby;
  Attribute *attr;
  size_t var;
  string fields;
  View *view;
  size_t viewID;
  ofstream ofs;
  string *in_stack_fffffffffffffb28;
  QueryCompiler *in_stack_fffffffffffffb30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb38;
  TreeDecomposition *in_stack_fffffffffffffb40;
  char *in_stack_fffffffffffffb50;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  string *__lhs_01;
  string local_480 [32];
  string local_460 [32];
  string local_440 [32];
  string local_420 [32];
  string local_400 [32];
  string local_3e0 [32];
  string local_3c0 [32];
  string local_3a0 [32];
  string local_380 [32];
  string local_360 [32];
  string local_340 [32];
  string local_320 [32];
  QueryCompiler *local_300;
  string local_2f8 [39];
  undefined1 local_2d1 [33];
  string local_2b0 [32];
  TreeDecomposition *local_290;
  reference local_288;
  ulong local_278;
  allocator local_269;
  string local_268 [32];
  View *local_248;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_240;
  string local_228 [32];
  ostream local_208 [520];
  
  __lhs_01 = local_228;
  std::operator+(in_stack_fffffffffffffb58,in_stack_fffffffffffffb50);
  std::ofstream::ofstream(local_208,__lhs_01,_S_out);
  std::__cxx11::string::~string(local_228);
  local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  while( true ) {
    __rhs_00 = local_240;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3138b9);
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            QueryCompiler::numberOfViews((QueryCompiler *)0x3138c1);
    if (__lhs <= __rhs_00) break;
    std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x3138e9);
    __lhs_00 = QueryCompiler::getView(in_stack_fffffffffffffb30,(size_t)in_stack_fffffffffffffb28);
    __rhs = &local_269;
    local_248 = __lhs_00;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_268,"",__rhs);
    std::allocator<char>::~allocator((allocator<char> *)&local_269);
    for (local_278 = 0; local_278 < 100; local_278 = local_278 + 1) {
      std::bitset<100UL>::operator[]
                ((bitset<100UL> *)in_stack_fffffffffffffb38,(size_t)in_stack_fffffffffffffb30);
      bVar1 = std::bitset::reference::operator_cast_to_bool((reference *)in_stack_fffffffffffffb30);
      std::bitset<100UL>::reference::~reference(&local_288);
      if (bVar1) {
        std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x3139be);
        in_stack_fffffffffffffb40 =
             (TreeDecomposition *)
             TreeDecomposition::getAttribute
                       (in_stack_fffffffffffffb40,(size_t)in_stack_fffffffffffffb38);
        local_290 = in_stack_fffffffffffffb40;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs_00
                       ,(char *)__rhs);
        std::__cxx11::string::operator+=(local_268,local_2b0);
        std::__cxx11::string::~string(local_2b0);
      }
    }
    in_stack_fffffffffffffb38 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_2d1 + 1),"",(allocator *)in_stack_fffffffffffffb38);
    std::allocator<char>::~allocator((allocator<char> *)local_2d1);
    uVar2 = std::__cxx11::string::empty();
    if ((uVar2 & 1) == 0) {
      std::operator+((char *)__lhs_01,in_RDI);
      std::__cxx11::string::operator+=((string *)(local_2d1 + 1),local_2f8);
      std::__cxx11::string::~string(local_2f8);
      std::__cxx11::string::pop_back();
    }
    local_300 = (QueryCompiler *)0x0;
    while (in_stack_fffffffffffffb30 = local_300,
          pQVar3 = (QueryCompiler *)
                   std::vector<Aggregate_*,_std::allocator<Aggregate_*>_>::size
                             (&local_248->_aggregates), in_stack_fffffffffffffb30 < pQVar3) {
      std::__cxx11::to_string((unsigned_long)__lhs);
      std::operator+((char *)in_stack_fffffffffffffb38,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb30);
      std::operator+(in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30);
      std::__cxx11::to_string((unsigned_long)__lhs);
      std::operator+(__lhs,__rhs_00);
      std::operator+(in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30);
      std::__cxx11::string::operator+=(local_268,local_320);
      std::__cxx11::string::~string(local_320);
      std::__cxx11::string::~string(local_340);
      std::__cxx11::string::~string(local_3c0);
      std::__cxx11::string::~string(local_360);
      std::__cxx11::string::~string(local_380);
      std::__cxx11::string::~string(local_3a0);
      local_300 = (QueryCompiler *)
                  ((long)&(local_300->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                  1);
    }
    in_stack_fffffffffffffb28 = local_268;
    std::__cxx11::string::pop_back();
    std::operator+((char *)__lhs_01,in_RDI);
    std::operator+(in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30);
    std::__cxx11::to_string((unsigned_long)__lhs);
    std::operator+(__lhs,__rhs_00);
    std::operator+(in_stack_fffffffffffffb38,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb30);
    std::operator+(in_stack_fffffffffffffb38,(char *)in_stack_fffffffffffffb30);
    std::operator<<(local_208,local_3e0);
    std::__cxx11::string::~string(local_3e0);
    std::__cxx11::string::~string(local_400);
    std::__cxx11::string::~string(local_420);
    std::__cxx11::string::~string(local_480);
    std::__cxx11::string::~string(local_440);
    std::__cxx11::string::~string(local_460);
    std::__cxx11::string::~string((string *)(local_2d1 + 1));
    std::__cxx11::string::~string(local_268);
    local_240 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &local_240->field_0x1;
  }
  std::ofstream::close();
  std::ofstream::~ofstream(local_208);
  return;
}

Assistant:

void SqlGenerator::generateOutputQueries()
{
    ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"/output.sql");
    
    for (size_t viewID = 0; viewID < _qc->numberOfViews(); ++viewID)
    {
        View* view = _qc->getView(viewID);
        std::string fields = "";
        for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
        {
            if (view->_fVars[var])
            {
                Attribute* attr = _td->getAttribute(var);
                fields += attr->_name+",";
            }
        }
        std::string orderby = "";
        if (!fields.empty())
        {
            orderby += " ORDER BY "+fields;
            orderby.pop_back();
        }

        for (size_t agg = 0; agg < view->_aggregates.size(); ++agg)
            fields += "CAST(agg_"+std::to_string(viewID)+"_"+std::to_string(agg)+
                " AS decimal(53,2)),";

        fields.pop_back();
        
        ofs << "\\COPY (SELECT "+fields+" FROM view_"+to_string(viewID)+orderby+
            ") TO PROGRAM \'cat - >> test.out\' CSV DELIMITER \'|\';\n\n";
    }
    ofs.close();
}